

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  undefined1 n [16];
  string_view prefix;
  format_specs specs;
  int iVar1;
  long in_RDI;
  string_view sVar2;
  undefined1 in_stack_00000000 [16];
  dec_writer in_stack_00000010;
  int num_digits;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  char *pcVar3;
  size_t sVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  pcVar3 = *(char **)(in_RDI + 0x10);
  sVar4 = *(size_t *)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff38;
  n._0_8_ = in_stack_ffffffffffffff30;
  iVar1 = count_digits((uint128_t)n);
  sVar2 = get_prefix((int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)0x203ead);
  prefix.size_ = sVar4;
  prefix.data_ = pcVar3;
  specs.precision = iVar1;
  specs.width = in_stack_fffffffffffffff0;
  specs.type = (char)in_RDI;
  specs._9_3_ = (int3)((ulong)in_RDI >> 8);
  specs.fill.data_[0] = (int)((ulong)in_RDI >> 0x20);
  specs.fill._4_16_ = in_stack_00000000;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::dec_writer>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)sVar2.size_,sVar2.data_._4_4_,prefix,
             specs,in_stack_00000010);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }